

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.cpp
# Opt level: O1

void __thiscall
vectorgraphics::Polygon2D::Polygon2D
          (Polygon2D *this,
          vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
          *point_ptrs)

{
  vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  *this_00;
  pointer __args_1;
  long lVar1;
  ulong uVar2;
  undefined1 local_51;
  shared_ptr<vectorgraphics::LineSegment2D> local_50;
  vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
  *local_40;
  vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  *local_38;
  
  local_40 = (vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
              *)&this->line_segment_ptrs_;
  this_00 = &this->point_ptrs_;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->line_segment_ptrs_).
  super__Vector_base<std::shared_ptr<vectorgraphics::LineSegment2D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
  ::vector(this_00,point_ptrs);
  __args_1 = (this->point_ptrs_).
             super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = 1;
  local_38 = this_00;
  if (0x10 < (ulong)((long)(this->point_ptrs_).
                           super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)__args_1)) {
    lVar1 = 0x10;
    do {
      local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<vectorgraphics::LineSegment2D,std::allocator<vectorgraphics::LineSegment2D>,std::shared_ptr<vectorgraphics::Point2D>&,std::shared_ptr<vectorgraphics::Point2D>&>
                (&local_50.
                  super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(LineSegment2D **)&local_50,
                 (allocator<vectorgraphics::LineSegment2D> *)&local_51,
                 (shared_ptr<vectorgraphics::Point2D> *)
                 ((long)&__args_1[-1].
                         super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar1),
                 (shared_ptr<vectorgraphics::Point2D> *)
                 ((long)&(__args_1->
                         super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar1));
      std::
      vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
      ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment2D>>(local_40,&local_50);
      if (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar2 = uVar2 + 1;
      __args_1 = (this->point_ptrs_).
                 super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (ulong)((long)(this->point_ptrs_).
                                   super__Vector_base<std::shared_ptr<vectorgraphics::Point2D>,_std::allocator<std::shared_ptr<vectorgraphics::Point2D>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)__args_1 >> 4)
            );
  }
  local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vectorgraphics::LineSegment2D,std::allocator<vectorgraphics::LineSegment2D>,std::shared_ptr<vectorgraphics::Point2D>&,std::shared_ptr<vectorgraphics::Point2D>&>
            (&local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(LineSegment2D **)&local_50,
             (allocator<vectorgraphics::LineSegment2D> *)&local_51,__args_1 + (uVar2 - 1),__args_1);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment2D>,std::allocator<std::shared_ptr<vectorgraphics::LineSegment2D>>>
  ::emplace_back<std::shared_ptr<vectorgraphics::LineSegment2D>>(local_40,&local_50);
  if (local_50.super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<vectorgraphics::LineSegment2D,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

Polygon2D::Polygon2D(std::vector<Point2DPtr> point_ptrs) :
    point_ptrs_(point_ptrs) {
    size_t index=1;
    while(index < point_ptrs_.size()) {
      line_segment_ptrs_.push_back(std::make_shared<LineSegment2D>(point_ptrs_[index-1], point_ptrs_[index]));
      index += 1;
    }
    line_segment_ptrs_.push_back(std::make_shared<LineSegment2D>(point_ptrs_[index-1], point_ptrs_[0]));
  }